

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

void __thiscall smf::MidiFile::sortTrackNoteOnsBeforeOffs(MidiFile *this,int track)

{
  pointer ppMVar1;
  ostream *poVar2;
  ulong uVar3;
  
  if (-1 < track) {
    ppMVar1 = (this->m_events).
              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar3 = (long)(this->m_events).
                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1;
    if (track < (int)(uVar3 >> 3)) {
      if ((ulong)(uint)track < (ulong)((long)uVar3 >> 3)) {
        MidiEventList::sortNoteOnsBeforeOffs(ppMVar1[(uint)track]);
        return;
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Warning: track ",0xf);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,track);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," does not exist.",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void MidiFile::sortTrackNoteOnsBeforeOffs(int track) {
	if ((track >= 0) && (track < getTrackCount())) {
		m_events.at(track)->sortNoteOnsBeforeOffs();
	} else {
		std::cerr << "Warning: track " << track << " does not exist." << std::endl;
	}
}